

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O0

rational<int> * __thiscall tcb::rational<int>::operator/=(rational<int> *this,rational<int> *other)

{
  value_type_conflict vVar1;
  rational<int> *other_local;
  rational<int> *this_local;
  
  vVar1 = denom(other);
  this->num_ = vVar1 * this->num_;
  vVar1 = num(other);
  this->denom_ = vVar1 * this->denom_;
  simplify(this);
  return this;
}

Assistant:

TCB_CONSTEXPR14 rational& operator/=(const rational<U>& other)
    {
        num_ *= other.denom();
        denom_ *= other.num();
        simplify();
        return *this;
    }